

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result_modifier.cpp
# Opt level: O0

string * __thiscall duckdb::OrderByNode::ToString_abi_cxx11_(OrderByNode *this)

{
  pointer pPVar1;
  char *in_RSI;
  string *in_RDI;
  string *str;
  string *psVar2;
  
  psVar2 = in_RDI;
  pPVar1 = unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
           ::operator->((unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                         *)in_RDI);
  (*(pPVar1->super_BaseExpression)._vptr_BaseExpression[8])(in_RDI);
  if (*in_RSI == '\x02') {
    ::std::__cxx11::string::operator+=((string *)in_RDI," ASC");
  }
  else if (*in_RSI == '\x03') {
    ::std::__cxx11::string::operator+=((string *)in_RDI," DESC");
  }
  if (in_RSI[1] == '\x02') {
    ::std::__cxx11::string::operator+=((string *)in_RDI," NULLS FIRST");
  }
  else if (in_RSI[1] == '\x03') {
    ::std::__cxx11::string::operator+=((string *)in_RDI," NULLS LAST");
  }
  return psVar2;
}

Assistant:

string OrderByNode::ToString() const {
	auto str = expression->ToString();
	switch (type) {
	case OrderType::ASCENDING:
		str += " ASC";
		break;
	case OrderType::DESCENDING:
		str += " DESC";
		break;
	default:
		break;
	}

	switch (null_order) {
	case OrderByNullType::NULLS_FIRST:
		str += " NULLS FIRST";
		break;
	case OrderByNullType::NULLS_LAST:
		str += " NULLS LAST";
		break;
	default:
		break;
	}
	return str;
}